

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O0

uint32_t ivk::cmd_fread(void *el)

{
  uint uVar1;
  XMLElement *this;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  pointer ppVar6;
  pointer ppVar7;
  size_t sVar8;
  char *local_150;
  uint local_110;
  uint32_t ret;
  uint32_t mem_size;
  uint32_t type_size;
  allocator local_f9;
  string local_f8 [32];
  _Self local_d8;
  iterator itt;
  allocator local_c1;
  string local_c0 [32];
  _Self local_a0;
  iterator itm;
  FILE *f;
  allocator local_71;
  string local_70 [32];
  _Self local_50;
  iterator it;
  XMLError er;
  int sz;
  char *ty;
  char *me;
  char *hd;
  XMLElement *e;
  XMLElement **ep;
  void *el_local;
  
  this = *el;
  pcVar4 = get_attr_val((XMLElement **)el,"handle");
  pcVar5 = get_attr_val((XMLElement **)el,"memory");
  local_150 = get_attr_val((XMLElement **)el,"type");
  it._M_node._4_4_ = 0;
  it._M_node._0_4_ =
       tinyxml2::XMLElement::QueryIntAttribute(this,"size",(int *)((long)&it._M_node + 4));
  if ((pcVar4 == (char *)0x0) || (pcVar5 == (char *)0x0)) {
    el_local._4_4_ = 5;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,pcVar4,&local_71);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                 *)gCmdMemMap_abi_cxx11_,(key_type *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    f = (FILE *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                       *)gCmdMemMap_abi_cxx11_);
    bVar2 = std::operator==(&local_50,(_Self *)&f);
    if (bVar2) {
      el_local._4_4_ = 7;
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
               ::operator->(&local_50);
      itm._M_node = (_Base_ptr)(ppVar6->second).data;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,pcVar5,&local_c1);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                   *)gCmdMemMap_abi_cxx11_,(key_type *)local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      itt._M_node = (_Base_ptr)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                           *)gCmdMemMap_abi_cxx11_);
      bVar2 = std::operator==(&local_a0,(_Self *)&itt);
      if (bVar2) {
        el_local._4_4_ = 7;
      }
      else {
        if (local_150 == (char *)0x0) {
          local_150 = "char";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,local_150,&local_f9);
        local_d8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     *)gBaseTypeMap_abi_cxx11_,(key_type *)local_f8);
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        _mem_size = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)gBaseTypeMap_abi_cxx11_);
        bVar2 = std::operator==(&local_d8,(_Self *)&mem_size);
        if (bVar2) {
          el_local._4_4_ = 6;
        }
        else {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                   ::operator->(&local_d8);
          uVar1 = ppVar7->second;
          if ((XMLError)it._M_node == XML_NO_ERROR) {
            uVar3 = it._M_node._4_4_ * uVar1;
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                     ::operator->(&local_a0);
            if ((ppVar6->second).size < uVar3) {
              ppVar6 = std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                       ::operator->(&local_a0);
              local_110 = (ppVar6->second).size;
            }
            else {
              local_110 = it._M_node._4_4_ * uVar1;
            }
          }
          else {
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                     ::operator->(&local_a0);
            local_110 = (ppVar6->second).size;
          }
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                   ::operator->(&local_a0);
          if ((ppVar6->second).size < local_110) {
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                     ::operator->(&local_a0);
            local_110 = (ppVar6->second).size;
          }
          ppVar6 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                   ::operator->(&local_a0);
          sVar8 = fread((ppVar6->second).data,1,(ulong)local_110,(FILE *)itm._M_node);
          setret((uint32_t)sVar8);
          el_local._4_4_ = 0;
        }
      }
    }
  }
  return el_local._4_4_;
}

Assistant:

uint32_t ivk::cmd_fread(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* me = get_attr_val(ep,"memory");
    const char* ty = get_attr_val(ep,"type");
    int sz=0;
    XMLError er = e->QueryIntAttribute("size",&sz);
    if(!hd || !me){
        return proc_xml_err;
    }

    // 查找文件句柄
    map<string,proc_data>::iterator it = gCmdMemMap.find(hd);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    FILE* f = (FILE*)it->second.data;

    // 查找内存
    map<string,proc_data>::iterator itm = gCmdMemMap.find(me);
    if(itm==gCmdMemMap.end()){
        return proc_mem_err;
    }

    // 获取类型信息,如果没有指定类型,默认char
    map<string,uint32_t>::iterator itt = gBaseTypeMap.find(ty?ty:"char");
    if(itt==gBaseTypeMap.end()){
        return proc_type_err;
    }
    uint32_t type_size = itt->second;

    // 真正读取的内存空间
    uint32_t mem_size = 0;
    if(er==XML_NO_ERROR){
        if(sz*type_size>itm->second.size){
            mem_size = itm->second.size;
        }else{
            mem_size = sz*type_size;
        }
    }else{
        mem_size = itm->second.size;
    }

    // 如果大小过大则以内存空间大小为准
    if(mem_size>itm->second.size){
        mem_size = itm->second.size;
    }
    uint32_t ret = (uint32_t)fread(itm->second.data,1,mem_size,f);

    // 设置返回值为读取字节大小
    ivk::setret(ret);

    return proc_success;
}